

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O0

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setPricer(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *x,bool destroy)

{
  bool bVar1;
  byte in_DL;
  SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  undefined8 in_stack_ffffffffffffffa8;
  Pricing pr;
  SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffffb0;
  shared_ptr<soplex::Tolerances> *this_00;
  shared_ptr<soplex::Tolerances> local_28;
  byte local_11;
  SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_10;
  
  pr = (Pricing)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  if ((in_RDI->freePricer & 1U) != 0) {
    if (in_RDI->thepricer !=
        (SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0) {
      (*in_RDI->thepricer->_vptr_SPxPricer[0x15])();
    }
    in_RDI->thepricer =
         (SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)0x0;
  }
  if ((local_10 !=
       (SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0) && (local_10 != in_RDI->thepricer)) {
    setPricing(in_stack_ffffffffffffffb0,pr);
    bVar1 = isInitialized(in_RDI);
    if (bVar1) {
      (*local_10->_vptr_SPxPricer[1])(local_10,in_RDI);
    }
    else {
      (*local_10->_vptr_SPxPricer[2])();
    }
  }
  if ((in_RDI->thepricer !=
       (SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0) && (in_RDI->thepricer != local_10)) {
    (*in_RDI->thepricer->_vptr_SPxPricer[2])();
  }
  in_RDI->thepricer = local_10;
  if (in_RDI->thepricer !=
      (SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x0) {
    pSVar2 = in_RDI->thepricer;
    tolerances(in_RDI);
    this_00 = &local_28;
    std::shared_ptr<soplex::Tolerances>::shared_ptr
              (this_00,(shared_ptr<soplex::Tolerances> *)pSVar2);
    (*pSVar2->_vptr_SPxPricer[6])(pSVar2,this_00);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2d62e8);
  }
  in_RDI->freePricer = (bool)(local_11 & 1);
  return;
}

Assistant:

void SPxSolverBase<R>::setPricer(SPxPricer<R>* x, const bool destroy)
{

   assert(!freePricer || thepricer != nullptr);

   if(freePricer)
   {
      delete thepricer;
      thepricer = nullptr;
   }

   if(x != nullptr && x != thepricer)
   {
      setPricing(FULL);

      if(isInitialized())
         x->load(this);
      else
         x->clear();
   }

   if(thepricer && thepricer != x)
      thepricer->clear();

   thepricer = x;

   if(thepricer != nullptr)
      thepricer->setTolerances(this->tolerances());

   freePricer = destroy;
}